

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

int parse_der_pubkey(uchar *der,size_t len,mp_int *keyP,mp_int *keyQ,mp_int *keyG,mp_int *keyY)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *b;
  long lVar8;
  byte *pbVar9;
  
  uVar4 = 0;
  uVar5 = 0;
  if ((*der & 0x3f) == 0x30) {
    pbVar9 = der + len;
    bVar1 = der[1];
    uVar3 = (ulong)(char)bVar1;
    pbVar6 = der + 2;
    if ((long)uVar3 < 0) {
      if ((bVar1 & 0x7f) == 0) {
        uVar3 = 0;
      }
      else {
        lVar8 = 0;
        uVar3 = 0;
        do {
          uVar3 = (ulong)pbVar6[lVar8] | uVar3 << 8;
          lVar8 = lVar8 + 1;
        } while (((int)(char)bVar1 & 0x7fU) != (uint)lVar8);
        pbVar6 = der + (ulong)((bVar1 & 0x7f) - 1) + 3;
      }
    }
    if (der + uVar3 + 1 <= pbVar9) {
      pbVar7 = pbVar6;
      if ((*pbVar6 & 0x3f) == 0x30) {
        bVar1 = pbVar6[1];
        uVar3 = (ulong)(char)bVar1;
        pbVar7 = pbVar6 + 2;
        if ((long)uVar3 < 0) {
          if ((bVar1 & 0x7f) == 0) {
            uVar3 = 0;
          }
          else {
            lVar8 = 0;
            uVar3 = 0;
            do {
              uVar3 = (ulong)pbVar7[lVar8] | uVar3 << 8;
              lVar8 = lVar8 + 1;
            } while (((int)(char)bVar1 & 0x7fU) != (uint)lVar8);
            pbVar7 = pbVar6 + (ulong)((bVar1 & 0x7f) - 1) + 3;
          }
        }
        if (pbVar9 < pbVar6 + uVar3 + 1) {
          return 0;
        }
        if ((*pbVar7 & 0x3f) == 6) {
          bVar1 = pbVar7[1];
          uVar3 = (ulong)(char)bVar1;
          pbVar6 = pbVar7 + 2;
          if ((long)uVar3 < 0) {
            if ((bVar1 & 0x7f) == 0) {
              uVar3 = 0;
            }
            else {
              lVar8 = 0;
              uVar3 = 0;
              do {
                uVar3 = (ulong)pbVar6[lVar8] | uVar3 << 8;
                lVar8 = lVar8 + 1;
              } while (((int)(char)bVar1 & 0x7fU) != (uint)lVar8);
              pbVar6 = pbVar7 + (ulong)((bVar1 & 0x7f) - 1) + 3;
            }
          }
          if (uVar3 != 7) {
            return 0;
          }
          if (*(int *)(pbVar6 + 3) !=
              CONCAT31(parse_der_pubkey::ansi_x9_57._4_3_,parse_der_pubkey::ansi_x9_57[3]) ||
              *(int *)pbVar6 != parse_der_pubkey::ansi_x9_57._0_4_) {
            return 0;
          }
          pbVar7 = pbVar6 + 7;
        }
        if ((*pbVar7 & 0x3f) == 0x30) {
          bVar1 = pbVar7[1];
          uVar3 = (ulong)(char)bVar1;
          pbVar6 = pbVar7 + 2;
          if ((long)uVar3 < 0) {
            if ((bVar1 & 0x7f) == 0) {
              uVar3 = 0;
            }
            else {
              lVar8 = 0;
              uVar3 = 0;
              do {
                uVar3 = (ulong)pbVar6[lVar8] | uVar3 << 8;
                lVar8 = lVar8 + 1;
              } while (((int)(char)bVar1 & 0x7fU) != (uint)lVar8);
              pbVar6 = pbVar7 + (ulong)((bVar1 & 0x7f) - 1) + 3;
            }
          }
          if (pbVar9 < pbVar7 + uVar3 + 1) {
            return 0;
          }
          pbVar7 = pbVar6;
          if ((*pbVar6 & 0x3f) == 2) {
            bVar1 = pbVar6[1];
            uVar3 = (ulong)(char)bVar1;
            b = pbVar6 + 2;
            if ((long)uVar3 < 0) {
              if ((bVar1 & 0x7f) == 0) {
                uVar3 = 0;
              }
              else {
                lVar8 = 0;
                uVar3 = 0;
                do {
                  uVar3 = (ulong)b[lVar8] | uVar3 << 8;
                  lVar8 = lVar8 + 1;
                } while (((int)(char)bVar1 & 0x7fU) != (uint)lVar8);
                b = pbVar6 + (ulong)((bVar1 & 0x7f) - 1) + 3;
              }
            }
            pbVar7 = b + uVar3;
            if (pbVar9 < pbVar7) {
              return 0;
            }
            iVar2 = mp_read_unsigned_bin(keyP,b,(int)uVar3);
            if (iVar2 != 0) {
              return 0;
            }
          }
          if ((*pbVar7 & 0x3f) == 2) {
            bVar1 = pbVar7[1];
            uVar3 = (ulong)(char)bVar1;
            pbVar6 = pbVar7 + 2;
            if ((long)uVar3 < 0) {
              if ((bVar1 & 0x7f) == 0) {
                uVar3 = 0;
              }
              else {
                lVar8 = 0;
                uVar3 = 0;
                do {
                  uVar3 = (ulong)pbVar6[lVar8] | uVar3 << 8;
                  lVar8 = lVar8 + 1;
                } while (((int)(char)bVar1 & 0x7fU) != (uint)lVar8);
                pbVar6 = pbVar7 + (ulong)((bVar1 & 0x7f) - 1) + 3;
              }
            }
            pbVar7 = pbVar6 + uVar3;
            if (pbVar9 < pbVar7) {
              return 0;
            }
            iVar2 = mp_read_unsigned_bin(keyQ,pbVar6,(int)uVar3);
            if (iVar2 != 0) {
              return 0;
            }
          }
          if ((*pbVar7 & 0x3f) == 2) {
            bVar1 = pbVar7[1];
            uVar3 = (ulong)(char)bVar1;
            pbVar6 = pbVar7 + 2;
            if ((long)uVar3 < 0) {
              if ((bVar1 & 0x7f) == 0) {
                uVar3 = 0;
              }
              else {
                lVar8 = 0;
                uVar3 = 0;
                do {
                  uVar3 = (ulong)pbVar6[lVar8] | uVar3 << 8;
                  lVar8 = lVar8 + 1;
                } while (((int)(char)bVar1 & 0x7fU) != (uint)lVar8);
                pbVar6 = pbVar7 + (ulong)((bVar1 & 0x7f) - 1) + 3;
              }
            }
            pbVar7 = pbVar6 + uVar3;
            if (pbVar9 < pbVar7) {
              return 0;
            }
            iVar2 = mp_read_unsigned_bin(keyG,pbVar6,(int)uVar3);
            if (iVar2 != 0) {
              return 0;
            }
          }
        }
      }
      uVar5 = uVar4;
      if ((*pbVar7 & 0x3f) == 3) {
        bVar1 = pbVar7[1];
        uVar3 = (ulong)(char)bVar1;
        pbVar6 = pbVar7 + 2;
        if ((long)uVar3 < 0) {
          if ((bVar1 & 0x7f) == 0) {
            uVar3 = 0;
          }
          else {
            lVar8 = 0;
            uVar3 = 0;
            do {
              uVar3 = (ulong)pbVar6[lVar8] | uVar3 << 8;
              lVar8 = lVar8 + 1;
            } while (((int)(char)bVar1 & 0x7fU) != (uint)lVar8);
            pbVar6 = pbVar7 + (ulong)((bVar1 & 0x7f) - 1) + 3;
          }
        }
        if (((pbVar7 + uVar3 + 1 <= pbVar9) && (*pbVar6 == 0)) && ((pbVar6[1] & 0x3f) == 2)) {
          bVar1 = pbVar6[2];
          uVar3 = (ulong)(char)bVar1;
          pbVar7 = pbVar6 + 3;
          if ((long)uVar3 < 0) {
            if ((bVar1 & 0x7f) == 0) {
              uVar3 = 0;
            }
            else {
              lVar8 = 0;
              uVar3 = 0;
              do {
                uVar3 = (ulong)pbVar7[lVar8] | uVar3 << 8;
                lVar8 = lVar8 + 1;
              } while (((int)(char)bVar1 & 0x7fU) != (uint)lVar8);
              pbVar7 = pbVar6 + (ulong)((bVar1 & 0x7f) - 1) + 4;
            }
          }
          if (pbVar7 + uVar3 <= pbVar9) {
            iVar2 = mp_read_unsigned_bin(keyY,pbVar7,(int)uVar3);
            uVar5 = (uint)(iVar2 == 0);
          }
        }
      }
    }
  }
  return uVar5;
}

Assistant:

int parse_der_pubkey(const unsigned char* der, size_t len, mp_int* keyP, mp_int* keyQ, mp_int* keyG, mp_int* keyY)
{
	static unsigned char ansi_x9_57[] = { 0x2A, 0x86, 0x48, 0xCE, 0x38, 0x04, 0x01 };
	const unsigned char* end = der + len;

	SEQUENCE
	{
		if ((++der + _parse_length(&der)) > end)
			return 0;

		SEQUENCE
		{
			if ((++der + _parse_length(&der)) > end)
				return 0;

			OBJECT_IDENTIFIER
			{
				der++;
				size_t length = _parse_length(&der);

				if (length != sizeof(ansi_x9_57) || (length == sizeof(ansi_x9_57) && memcmp(der, ansi_x9_57, length) != 0))
					return 0;

				der += length;
			}

			SEQUENCE
			{
				if ((++der + _parse_length(&der)) > end)
					return 0;

				INTEGER
				{
					// p
					der++;
					size_t length = _parse_length(&der);

					if ((der + length) > end)
						return 0;

					if (mp_read_unsigned_bin(keyP, der, length) != MP_OKAY)
						return 0;

					der += length;
				}

				INTEGER
				{
					// q
					der++;
					size_t length = _parse_length(&der);

					if ((der + length) > end)
						return 0;

					if (mp_read_unsigned_bin(keyQ, der, length) != MP_OKAY)
						return 0;

					der += length;
				}

				INTEGER
				{
					// g
					der++;
					size_t length = _parse_length(&der);

					if ((der + length) > end)
						return 0;

					if (mp_read_unsigned_bin(keyG, der, length) != MP_OKAY)
						return 0;

					der += length;
				}
			}
		}

		BIT_STRING
		{
			if ((++der + _parse_length(&der)) > end)
				return 0;

			if (*der++ != 0)
				return 0;

			INTEGER
			{
				// y
				der++;
				size_t length = _parse_length(&der);

				if ((der + length) > end)
					return 0;

				return (mp_read_unsigned_bin(keyY, der, length) == MP_OKAY);
			}
		}
	}

	return 0;
}